

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  double *pdVar2;
  value_type vVar3;
  double dVar4;
  
  vVar3 = FadBinaryMul<FadCst<double>,_Fad<double>_>::dx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).right_;
  dVar4 = (this->right_->fadexpr_).left_.constant_ - pFVar1->val_;
  pdVar2 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar2 = (pFVar1->dx_).ptr_to_data + i;
  }
  return (vVar3 * dVar4 +
         (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ * *pdVar2)
         / (dVar4 * dVar4);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}